

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O2

void surv0_ctx_abort(surv0_ctx *ctx,int err)

{
  surv0_sock *psVar1;
  nni_aio *aio;
  
  psVar1 = ctx->sock;
  while( true ) {
    aio = (nni_aio *)nni_list_first(&ctx->recv_queue);
    if (aio == (nni_aio *)0x0) break;
    nni_list_remove(&ctx->recv_queue,aio);
    nni_aio_finish_error(aio,err);
  }
  nni_lmq_flush(&ctx->recv_lmq);
  if ((ulong)ctx->survey_id != 0) {
    nni_id_remove(&psVar1->surveys,(ulong)ctx->survey_id);
    ctx->survey_id = 0;
  }
  if (&psVar1->ctx != ctx) {
    return;
  }
  nni_pollable_clear(&psVar1->readable);
  return;
}

Assistant:

static void
surv0_ctx_abort(surv0_ctx *ctx, int err)
{
	nni_aio    *aio;
	surv0_sock *sock = ctx->sock;

	while ((aio = nni_list_first(&ctx->recv_queue)) != NULL) {
		nni_list_remove(&ctx->recv_queue, aio);
		nni_aio_finish_error(aio, err);
	}
	nni_lmq_flush(&ctx->recv_lmq);
	if (ctx->survey_id != 0) {
		nni_id_remove(&sock->surveys, ctx->survey_id);
		ctx->survey_id = 0;
	}
	if (ctx == &sock->ctx) {
		nni_pollable_clear(&sock->readable);
	}
}